

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::ConditionalDirectiveExpressionSyntax::isKind(SyntaxKind kind)

{
  if ((int)kind < 0x165) {
    if ((kind != BinaryConditionalDirectiveExpression) &&
       (kind != NamedConditionalDirectiveExpression)) {
      return false;
    }
  }
  else if ((kind != ParenthesizedConditionalDirectiveExpression) &&
          (kind != UnaryConditionalDirectiveExpression)) {
    return false;
  }
  return true;
}

Assistant:

bool ConditionalDirectiveExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::BinaryConditionalDirectiveExpression:
        case SyntaxKind::NamedConditionalDirectiveExpression:
        case SyntaxKind::ParenthesizedConditionalDirectiveExpression:
        case SyntaxKind::UnaryConditionalDirectiveExpression:
            return true;
        default:
            return false;
    }
}